

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distributions.h
# Opt level: O0

enable_if_t<_std::is_same<int,_void>::value,_int>
absl::lts_20250127::
Uniform<int,absl::lts_20250127::random_internal::NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,absl::lts_20250127::random_internal::RandenPoolSeedSeq>&>
          (NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,_absl::lts_20250127::random_internal::RandenPoolSeedSeq>
           *urbg,int lo,int hi)

{
  enable_if_t<IsIntegral<int>::value,_bool> eVar1;
  enable_if_t<absl::disjunction<std::is_same<IntervalClosedOpenTag,_IntervalClosedClosedTag>,_std::is_same<IntervalClosedOpenTag,_IntervalClosedOpenTag>_>::value,_int>
  a_00;
  enable_if_t<absl::conjunction<IsIntegral<int>,_absl::disjunction<std::is_same<IntervalClosedOpenTag,_IntervalClosedOpenTag>,_std::is_same<IntervalClosedOpenTag,_IntervalOpenOpenTag>_>_>::value,_int>
  b_00;
  enable_if_t<absl::conjunction<IsIntegral<int>,_absl::disjunction<std::is_same<IntervalClosedOpenTag,_IntervalClosedOpenTag>,_std::is_same<IntervalClosedOpenTag,_IntervalOpenOpenTag>_>_>::value,_int>
  b;
  enable_if_t<absl::disjunction<std::is_same<IntervalClosedOpenTag,_IntervalClosedClosedTag>,_std::is_same<IntervalClosedOpenTag,_IntervalClosedOpenTag>_>::value,_int>
  a;
  int iStack_1c;
  type_identity_t<IntervalClosedOpenTag> tag;
  int hi_local;
  int lo_local;
  NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,_absl::lts_20250127::random_internal::RandenPoolSeedSeq>
  *urbg_local;
  
  a = hi;
  iStack_1c = lo;
  a_00 = random_internal::uniform_lower_bound<int,absl::lts_20250127::IntervalClosedOpenTag>(lo,hi);
  b_00 = random_internal::uniform_upper_bound<int,absl::lts_20250127::IntervalClosedOpenTag>
                   (iStack_1c,a);
  eVar1 = random_internal::is_uniform_range_valid<int>(a_00,b_00);
  if (eVar1) {
    urbg_local._4_4_ =
         random_internal::
         DistributionCaller<absl::lts_20250127::random_internal::NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,absl::lts_20250127::random_internal::RandenPoolSeedSeq>>
         ::Call<absl::lts_20250127::random_internal::UniformDistributionWrapper<int>,int&,int&>
                   (urbg,&stack0xffffffffffffffe4,&a);
  }
  else {
    urbg_local._4_4_ = iStack_1c;
  }
  return urbg_local._4_4_;
}

Assistant:

typename absl::enable_if_t<!std::is_same<R, void>::value, R>  //
Uniform(URBG&& urbg,  // NOLINT(runtime/references)
        R lo, R hi) {
  using gen_t = absl::decay_t<URBG>;
  using distribution_t = random_internal::UniformDistributionWrapper<R>;
  constexpr auto tag = absl::IntervalClosedOpen;

  auto a = random_internal::uniform_lower_bound(tag, lo, hi);
  auto b = random_internal::uniform_upper_bound(tag, lo, hi);
  if (!random_internal::is_uniform_range_valid(a, b)) return lo;

  return random_internal::DistributionCaller<gen_t>::template Call<
      distribution_t>(&urbg, lo, hi);
}